

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::FirstMatchAssertionExpr::visitExprs<hgdb::rtl::ExpressionPrinter&>
          (FirstMatchAssertionExpr *this,ExpressionPrinter *visitor)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  
  AssertionExpr::visit<hgdb::rtl::ExpressionPrinter>(this->seq,visitor);
  ppEVar1 = (this->matchItems).data_;
  sVar2 = (this->matchItems).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<hgdb::rtl::ExpressionPrinter&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        seq.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }